

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O2

var __thiscall cs::function::call_vv(function *this,function *_this,vector *args)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer paVar2;
  _Elt_pointer ppsVar3;
  element_type *peVar4;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *this_00;
  var *pvVar5;
  element_type *peVar6;
  ulong uVar7;
  _Elt_pointer ppsVar8;
  char *name;
  _Elt_pointer ppsVar9;
  ulong uVar10;
  _Map_pointer pppsVar11;
  fcall_guard fcall;
  var arg_list;
  scope_guard scope;
  
  process_context::poll_event((process_context *)current_process);
  scope_guard::scope_guard(&scope,&_this->mContext);
  fcall_guard::fcall_guard(&fcall);
  cs_impl::any::make<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>();
  this_00 = cs_impl::any::val<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>(&arg_list);
  if (_this->mIsMemFn == true) {
    name = "this";
  }
  else {
    if (_this->mIsLambda == false) {
      uVar10 = 0;
      goto LAB_002ebdce;
    }
    name = "self";
  }
  domain_manager::add_var_no_return<char_const(&)[5]>
            (&(((((_this->mContext).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->instance).
                super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_runtime_type).storage,(char (*) [5])name,
             (args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
             super__Vector_impl_data._M_start);
  uVar10 = 1;
LAB_002ebdce:
  uVar7 = (ulong)(uint)((int)uVar10 * 8);
  for (; paVar2 = (args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                  super__Vector_impl_data._M_start,
      uVar10 < (ulong)((long)(args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)
                             ._M_impl.super__Vector_impl_data._M_finish - (long)paVar2 >> 3);
      uVar10 = uVar10 + 1) {
    std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::push_back
              (this_00,(value_type *)((long)&paVar2->mDat + uVar7));
    uVar7 = uVar7 + 8;
  }
  domain_manager::add_var_no_return<std::__cxx11::string_const&>
            (&(((((_this->mContext).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->instance).
                super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_runtime_type).storage,
             (_this->mArgs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&arg_list);
  cs_impl::any::recycle(&arg_list);
  ppsVar9 = (_this->mBody).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  ppsVar8 = (_this->mBody).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_last;
  pppsVar11 = (_this->mBody).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl
              .super__Deque_impl_data._M_start._M_node;
  ppsVar3 = (_this->mBody).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  do {
    if (ppsVar9 == ppsVar3) {
      pvVar5 = fcall_guard::get(&fcall);
LAB_002ebe86:
      peVar6 = (element_type *)pvVar5->mDat;
      if (peVar6 == (element_type *)0x0) {
        peVar6 = (element_type *)0x0;
      }
      else {
        p_Var1 = &(peVar6->compiler).
                  super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        p_Var1->_M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&p_Var1->_M_pi->_vptr__Sp_counted_base + 1);
      }
      (this->mContext).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           peVar6;
      fcall_guard::~fcall_guard(&fcall);
      scope_guard::~scope_guard(&scope);
      return (var)(proxy *)this;
    }
    statement_base::run(*ppsVar9);
    peVar4 = (((_this->mContext).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (peVar4->return_fcall == true) {
      peVar4->return_fcall = false;
      pvVar5 = fcall_guard::get(&fcall);
      goto LAB_002ebe86;
    }
    ppsVar9 = ppsVar9 + 1;
    if (ppsVar9 == ppsVar8) {
      ppsVar9 = pppsVar11[1];
      pppsVar11 = pppsVar11 + 1;
      ppsVar8 = ppsVar9 + 0x40;
    }
  } while( true );
}

Assistant:

var function::call_vv(const function *_this, vector &args)
	{
		current_process->poll_event();
		scope_guard scope(_this->mContext);
#ifdef CS_DEBUGGER
		fcall_guard fcall(_this->mDecl);
		if(_this->mMatch)
			cs_debugger_func_callback(_this->mDecl, _this->mStmt);
#else
		fcall_guard fcall;
#endif
		{
			var arg_list = var::make<cs::array>();
			auto &arr = arg_list.val<cs::array>();
			std::size_t i = 0;
			if (_this->mIsMemFn)
				_this->mContext->instance->storage.add_var_no_return("this", args[i++]);
			else if (_this->mIsLambda)
				_this->mContext->instance->storage.add_var_no_return("self", args[i++]);
			for (; i < args.size(); ++i)
				arr.push_back(args[i]);
			_this->mContext->instance->storage.add_var_no_return(_this->mArgs.front(), arg_list);
		}
		for (auto &ptr: _this->mBody) {
			try {
				ptr->run();
			}
			catch (const cs::exception &e) {
				throw e;
			}
			catch (const std::exception &e) {
				throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
			}
			if (_this->mContext->instance->return_fcall) {
				_this->mContext->instance->return_fcall = false;
				return fcall.get();
			}
		}
		return fcall.get();
	}